

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Btree * findBtree(sqlite3 *pErrorDb,sqlite3 *pDb,char *zDb)

{
  int iVar1;
  int iVar2;
  Parse *pParse_00;
  char cVar3;
  int rc;
  Parse *pParse;
  int i;
  char *zDb_local;
  sqlite3 *pDb_local;
  sqlite3 *pErrorDb_local;
  
  iVar1 = sqlite3FindDbName(pDb,zDb);
  if (iVar1 == 1) {
    pParse_00 = (Parse *)sqlite3DbMallocZero(pErrorDb,0x298);
    if (pParse_00 == (Parse *)0x0) {
      sqlite3Error(pErrorDb,7,"out of memory");
      cVar3 = '\a';
    }
    else {
      pParse_00->db = pDb;
      iVar2 = sqlite3OpenTempDatabase(pParse_00);
      cVar3 = iVar2 != 0;
      if ((bool)cVar3) {
        sqlite3Error(pErrorDb,pParse_00->rc,"%s",pParse_00->zErrMsg);
      }
      sqlite3DbFree(pErrorDb,pParse_00->zErrMsg);
      sqlite3DbFree(pErrorDb,pParse_00);
    }
    if (cVar3 != '\0') {
      return (Btree *)0x0;
    }
  }
  if (iVar1 < 0) {
    sqlite3Error(pErrorDb,1,"unknown database %s",zDb);
    pErrorDb_local = (sqlite3 *)0x0;
  }
  else {
    pErrorDb_local = (sqlite3 *)pDb->aDb[iVar1].pBt;
  }
  return (Btree *)pErrorDb_local;
}

Assistant:

static Btree *findBtree(sqlite3 *pErrorDb, sqlite3 *pDb, const char *zDb){
  int i = sqlite3FindDbName(pDb, zDb);

  if( i==1 ){
    Parse *pParse;
    int rc = 0;
    pParse = sqlite3StackAllocZero(pErrorDb, sizeof(*pParse));
    if( pParse==0 ){
      sqlite3Error(pErrorDb, SQLITE_NOMEM, "out of memory");
      rc = SQLITE_NOMEM;
    }else{
      pParse->db = pDb;
      if( sqlite3OpenTempDatabase(pParse) ){
        sqlite3Error(pErrorDb, pParse->rc, "%s", pParse->zErrMsg);
        rc = SQLITE_ERROR;
      }
      sqlite3DbFree(pErrorDb, pParse->zErrMsg);
      sqlite3StackFree(pErrorDb, pParse);
    }
    if( rc ){
      return 0;
    }
  }

  if( i<0 ){
    sqlite3Error(pErrorDb, SQLITE_ERROR, "unknown database %s", zDb);
    return 0;
  }

  return pDb->aDb[i].pBt;
}